

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIntegerStateQueryTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::CombinedUniformComponentsCase::iterate
          (CombinedUniformComponentsCase *this)

{
  TestLog *log;
  bool bVar1;
  ContextType ctxType;
  int iVar2;
  GLenum GVar3;
  GLenum GVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined8 *puVar6;
  long *plVar7;
  NotSupportedError *this_00;
  long *plVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  ulong uVar10;
  undefined8 uVar11;
  CallLogWrapper gl;
  StateQueryMemoryWriteGuard<int> maxUniformComponents;
  StateQueryMemoryWriteGuard<int> maxUniformBlockSize;
  StateQueryMemoryWriteGuard<int> maxUniformBlocks;
  ResultCollector result;
  long *local_2d8;
  undefined8 local_2d0;
  long local_2c8;
  undefined8 uStack_2c0;
  string local_2b8;
  ulong *local_298;
  long local_290;
  ulong local_288 [2];
  long *local_278;
  long local_270;
  long local_268;
  long lStack_260;
  CallLogWrapper local_258;
  StateQueryMemoryWriteGuard<int> local_240;
  StateQueryMemoryWriteGuard<int> local_230;
  StateQueryMemoryWriteGuard<int> local_220;
  code *local_210;
  GLenum local_208;
  ResultCollector local_200;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)(this->m_minimumVersion).m_bits);
  if (!bVar1) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Test not supported in this context.",
               "contextSupports(m_context.getRenderContext().getType(), m_minimumVersion)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIntegerStateQueryTests.cpp"
               ,0x1ff);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_258,(Functions *)CONCAT44(extraout_var,iVar2),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_1b0 = (undefined1  [8])local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0," // ERROR: ","");
  tcu::ResultCollector::ResultCollector(&local_200,log,(string *)local_1b0);
  if (local_1b0 != (undefined1  [8])local_1a0) {
    operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
  }
  GVar4 = this->m_target;
  if (GVar4 == 0x8266) {
    GVar3 = 0x91bb;
  }
  else if (GVar4 == 0x8e1e) {
    GVar3 = 0x8e89;
  }
  else if (GVar4 == 0x8e1f) {
    GVar3 = 0x8e8a;
  }
  else {
    GVar3 = -(uint)(GVar4 != 0x8a32) | 0x8a2c;
  }
  if (GVar4 == 0x8266) {
    GVar4 = 0x8263;
  }
  else if (GVar4 == 0x8e1e) {
    GVar4 = 0x8e7f;
  }
  else if (GVar4 == 0x8e1f) {
    GVar4 = 0x8e80;
  }
  else {
    GVar4 = -(uint)(GVar4 != 0x8a32) | 0x8ddf;
  }
  local_258.m_enableLog = true;
  local_1b0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,
             "The minimum value of MAX_COMBINED_COMPUTE_UNIFORM_COMPONENTS is MAX_COMPUTE_UNIFORM_BLOCKS x MAX_UNIFORM_BLOCK_SIZE / 4 + MAX_COMPUTE_UNIFORM_COMPONENTS"
             ,0x98);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  local_220.m_preguard = -0x21212122;
  local_220.m_value = -0x21212122;
  local_220.m_postguard = -0x21212122;
  glu::CallLogWrapper::glGetIntegerv(&local_258,GVar3,&local_220.m_value);
  GVar3 = glu::CallLogWrapper::glGetError(&local_258);
  if (GVar3 != 0) {
    local_298 = local_288;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"Got Error ","");
    local_210 = glu::getErrorName;
    local_208 = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_2b8,&local_210);
    uVar10 = 0xf;
    if (local_298 != local_288) {
      uVar10 = local_288[0];
    }
    if (uVar10 < local_2b8._M_string_length + local_290) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        uVar11 = local_2b8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_2b8._M_string_length + local_290) goto LAB_0152bba2;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2b8,0,(char *)0x0,(ulong)local_298);
    }
    else {
LAB_0152bba2:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_298,(ulong)local_2b8._M_dataplus._M_p)
      ;
    }
    local_2d8 = &local_2c8;
    plVar7 = puVar6 + 2;
    if ((long *)*puVar6 == plVar7) {
      local_2c8 = *plVar7;
      uStack_2c0 = puVar6[3];
    }
    else {
      local_2c8 = *plVar7;
      local_2d8 = (long *)*puVar6;
    }
    local_2d0 = puVar6[1];
    *puVar6 = plVar7;
    puVar6[1] = 0;
    *(undefined1 *)plVar7 = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d8);
    plVar8 = plVar7 + 2;
    if ((long *)*plVar7 == plVar8) {
      local_268 = *plVar8;
      lStack_260 = plVar7[3];
      local_278 = &local_268;
    }
    else {
      local_268 = *plVar8;
      local_278 = (long *)*plVar7;
    }
    local_270 = plVar7[1];
    *plVar7 = (long)plVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_278);
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 == paVar9) {
      local_1a0[0]._0_8_ = paVar9->_M_allocated_capacity;
      local_1a0[0]._8_8_ = plVar7[3];
      local_1b0 = (undefined1  [8])local_1a0;
    }
    else {
      local_1a0[0]._0_8_ = paVar9->_M_allocated_capacity;
      local_1b0 = (undefined1  [8])*plVar7;
    }
    local_1a8 = (_func_int **)plVar7[1];
    *plVar7 = (long)paVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    tcu::ResultCollector::fail(&local_200,(string *)local_1b0);
    if (local_1b0 != (undefined1  [8])local_1a0) {
      operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_2d8 != &local_2c8) {
      operator_delete(local_2d8,local_2c8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    if (local_298 != local_288) {
      operator_delete(local_298,local_288[0] + 1);
    }
  }
  local_230.m_preguard = -0x21212122;
  local_230.m_value = -0x21212122;
  local_230.m_postguard = -0x21212122;
  glu::CallLogWrapper::glGetIntegerv(&local_258,0x8a30,&local_230.m_value);
  GVar3 = glu::CallLogWrapper::glGetError(&local_258);
  if (GVar3 != 0) {
    local_298 = local_288;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"Got Error ","");
    local_210 = glu::getErrorName;
    local_208 = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_2b8,&local_210);
    uVar10 = 0xf;
    if (local_298 != local_288) {
      uVar10 = local_288[0];
    }
    if (uVar10 < local_2b8._M_string_length + local_290) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        uVar11 = local_2b8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_2b8._M_string_length + local_290) goto LAB_0152be0c;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2b8,0,(char *)0x0,(ulong)local_298);
    }
    else {
LAB_0152be0c:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_298,(ulong)local_2b8._M_dataplus._M_p)
      ;
    }
    local_2d8 = &local_2c8;
    plVar7 = puVar6 + 2;
    if ((long *)*puVar6 == plVar7) {
      local_2c8 = *plVar7;
      uStack_2c0 = puVar6[3];
    }
    else {
      local_2c8 = *plVar7;
      local_2d8 = (long *)*puVar6;
    }
    local_2d0 = puVar6[1];
    *puVar6 = plVar7;
    puVar6[1] = 0;
    *(undefined1 *)plVar7 = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d8);
    plVar8 = plVar7 + 2;
    if ((long *)*plVar7 == plVar8) {
      local_268 = *plVar8;
      lStack_260 = plVar7[3];
      local_278 = &local_268;
    }
    else {
      local_268 = *plVar8;
      local_278 = (long *)*plVar7;
    }
    local_270 = plVar7[1];
    *plVar7 = (long)plVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_278);
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 == paVar9) {
      local_1a0[0]._0_8_ = paVar9->_M_allocated_capacity;
      local_1a0[0]._8_8_ = plVar7[3];
      local_1b0 = (undefined1  [8])local_1a0;
    }
    else {
      local_1a0[0]._0_8_ = paVar9->_M_allocated_capacity;
      local_1b0 = (undefined1  [8])*plVar7;
    }
    local_1a8 = (_func_int **)plVar7[1];
    *plVar7 = (long)paVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    tcu::ResultCollector::fail(&local_200,(string *)local_1b0);
    if (local_1b0 != (undefined1  [8])local_1a0) {
      operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_2d8 != &local_2c8) {
      operator_delete(local_2d8,local_2c8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    if (local_298 != local_288) {
      operator_delete(local_298,local_288[0] + 1);
    }
  }
  local_240.m_preguard = -0x21212122;
  local_240.m_value = -0x21212122;
  local_240.m_postguard = -0x21212122;
  glu::CallLogWrapper::glGetIntegerv(&local_258,GVar4,&local_240.m_value);
  GVar4 = glu::CallLogWrapper::glGetError(&local_258);
  if (GVar4 == 0) goto LAB_0152c21c;
  local_298 = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"Got Error ","");
  local_210 = glu::getErrorName;
  local_208 = GVar4;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_2b8,&local_210);
  uVar10 = 0xf;
  if (local_298 != local_288) {
    uVar10 = local_288[0];
  }
  if (uVar10 < local_2b8._M_string_length + local_290) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      uVar11 = local_2b8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_2b8._M_string_length + local_290) goto LAB_0152c071;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_2b8,0,(char *)0x0,(ulong)local_298);
  }
  else {
LAB_0152c071:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_298,(ulong)local_2b8._M_dataplus._M_p);
  }
  local_2d8 = &local_2c8;
  plVar7 = puVar6 + 2;
  if ((long *)*puVar6 == plVar7) {
    local_2c8 = *plVar7;
    uStack_2c0 = puVar6[3];
  }
  else {
    local_2c8 = *plVar7;
    local_2d8 = (long *)*puVar6;
  }
  local_2d0 = puVar6[1];
  *puVar6 = plVar7;
  puVar6[1] = 0;
  *(undefined1 *)plVar7 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d8);
  plVar8 = plVar7 + 2;
  if ((long *)*plVar7 == plVar8) {
    local_268 = *plVar8;
    lStack_260 = plVar7[3];
    local_278 = &local_268;
  }
  else {
    local_268 = *plVar8;
    local_278 = (long *)*plVar7;
  }
  local_270 = plVar7[1];
  *plVar7 = (long)plVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_278);
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 == paVar9) {
    local_1a0[0]._0_8_ = paVar9->_M_allocated_capacity;
    local_1a0[0]._8_8_ = plVar7[3];
    local_1b0 = (undefined1  [8])local_1a0;
  }
  else {
    local_1a0[0]._0_8_ = paVar9->_M_allocated_capacity;
    local_1b0 = (undefined1  [8])*plVar7;
  }
  local_1a8 = (_func_int **)plVar7[1];
  *plVar7 = (long)paVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  tcu::ResultCollector::fail(&local_200,(string *)local_1b0);
  if (local_1b0 != (undefined1  [8])local_1a0) {
    operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
  }
  if (local_278 != &local_268) {
    operator_delete(local_278,local_268 + 1);
  }
  if (local_2d8 != &local_2c8) {
    operator_delete(local_2d8,local_2c8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if (local_298 != local_288) {
    operator_delete(local_298,local_288[0] + 1);
  }
LAB_0152c21c:
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    (&local_220,&local_200);
  if (bVar1) {
    bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                      (&local_230,&local_200);
    if (bVar1) {
      bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                        (&local_240,&local_200);
      if (bVar1) {
        iVar5 = local_230.m_value * local_220.m_value;
        iVar2 = iVar5 + 3;
        if (-1 < iVar5) {
          iVar2 = iVar5;
        }
        deqp::gls::StateQueryUtil::verifyStateIntegerMin
                  (&local_200,&local_258,this->m_target,(iVar2 >> 2) + local_240.m_value,
                   this->m_verifierType);
      }
    }
  }
  tcu::ResultCollector::setTestContextResult
            (&local_200,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200.m_message._M_dataplus._M_p != &local_200.m_message.field_2) {
    operator_delete(local_200.m_message._M_dataplus._M_p,
                    local_200.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200.m_prefix._M_dataplus._M_p != &local_200.m_prefix.field_2) {
    operator_delete(local_200.m_prefix._M_dataplus._M_p,
                    local_200.m_prefix.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::~CallLogWrapper(&local_258);
  return STOP;
}

Assistant:

CombinedUniformComponentsCase::IterateResult CombinedUniformComponentsCase::iterate (void)
{
	TCU_CHECK_AND_THROW(NotSupportedError, contextSupports(m_context.getRenderContext().getType(), m_minimumVersion), "Test not supported in this context.");

	glu::CallLogWrapper		gl							(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result						(m_testCtx.getLog(), " // ERROR: ");

	const glw::GLenum		maxUniformBlocksEnum		= (m_target == GL_MAX_COMBINED_COMPUTE_UNIFORM_COMPONENTS) ? GL_MAX_COMPUTE_UNIFORM_BLOCKS
														: (m_target == GL_MAX_COMBINED_TESS_CONTROL_UNIFORM_COMPONENTS) ? GL_MAX_TESS_CONTROL_UNIFORM_BLOCKS
														: (m_target == GL_MAX_COMBINED_TESS_EVALUATION_UNIFORM_COMPONENTS) ? GL_MAX_TESS_EVALUATION_UNIFORM_BLOCKS
														: (m_target == GL_MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS) ? GL_MAX_GEOMETRY_UNIFORM_BLOCKS
														: -1;

	const glw::GLenum		maxUniformComponentsEnum	= (m_target == GL_MAX_COMBINED_COMPUTE_UNIFORM_COMPONENTS) ? GL_MAX_COMPUTE_UNIFORM_COMPONENTS
														: (m_target == GL_MAX_COMBINED_TESS_CONTROL_UNIFORM_COMPONENTS) ? GL_MAX_TESS_CONTROL_UNIFORM_COMPONENTS
														: (m_target == GL_MAX_COMBINED_TESS_EVALUATION_UNIFORM_COMPONENTS) ? GL_MAX_TESS_EVALUATION_UNIFORM_COMPONENTS
														: (m_target == GL_MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS) ? GL_MAX_GEOMETRY_UNIFORM_COMPONENTS
														: -1;

	gl.enableLogging(true);

	m_testCtx.getLog()	<< tcu::TestLog::Message
						<< "The minimum value of MAX_COMBINED_COMPUTE_UNIFORM_COMPONENTS is MAX_COMPUTE_UNIFORM_BLOCKS x MAX_UNIFORM_BLOCK_SIZE / 4 + MAX_COMPUTE_UNIFORM_COMPONENTS"
						<< tcu::TestLog::EndMessage;

	StateQueryMemoryWriteGuard<glw::GLint> maxUniformBlocks;
	gl.glGetIntegerv(maxUniformBlocksEnum, &maxUniformBlocks);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGetIntegerv");

	StateQueryMemoryWriteGuard<glw::GLint> maxUniformBlockSize;
	gl.glGetIntegerv(GL_MAX_UNIFORM_BLOCK_SIZE, &maxUniformBlockSize);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGetIntegerv");

	StateQueryMemoryWriteGuard<glw::GLint> maxUniformComponents;
	gl.glGetIntegerv(maxUniformComponentsEnum, &maxUniformComponents);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGetIntegerv");

	if (maxUniformBlocks.verifyValidity(result) && maxUniformBlockSize.verifyValidity(result) && maxUniformComponents.verifyValidity(result))
		verifyStateIntegerMin(result, gl, m_target, ((int)maxUniformBlocks) * ((int)maxUniformBlockSize) / 4 + (int)maxUniformComponents, m_verifierType);

	result.setTestContextResult(m_testCtx);
	return STOP;
}